

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.c
# Opt level: O3

deBool deSocket_setFlags(deSocket *sock,deUint32 flags)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int mode_1;
  int mode;
  uint local_20;
  uint local_1c;
  
  iVar4 = sock->handle;
  uVar3 = 0;
  if (sock->state != DE_SOCKETSTATE_CLOSED) {
    local_1c = flags & 1;
    iVar1 = setsockopt(iVar4,1,9,&local_1c,4);
    if (iVar1 == 0) {
      local_20 = flags >> 1 & 1;
      iVar1 = setsockopt(iVar4,6,1,&local_20,4);
      if (iVar1 == 0) {
        uVar3 = 0;
        uVar2 = fcntl(iVar4,3,0);
        iVar1 = fcntl(iVar4,4,(ulong)((flags & 4) << 9 | uVar2 & 0xfffff7ff));
        if (iVar1 == 0) {
          uVar3 = fcntl(iVar4,1,0);
          iVar4 = fcntl(iVar4,2,(ulong)(flags >> 3 & 1 | uVar3 & 0xfffffffe));
          uVar3 = (uint)(iVar4 == 0);
        }
      }
    }
  }
  return uVar3;
}

Assistant:

deBool deSocket_setFlags (deSocket* sock, deUint32 flags)
{
	deSocketHandle fd = sock->handle;

	if (sock->state == DE_SOCKETSTATE_CLOSED)
		return DE_FALSE;

	/* Keepalive. */
	{
		int mode = (flags & DE_SOCKET_KEEPALIVE) ? 1 : 0;
		if (setsockopt(fd, SOL_SOCKET, SO_KEEPALIVE, (const char*)&mode, sizeof(mode)) != 0)
			return DE_FALSE;
	}

	/* Nodelay. */
	{
		int mode = (flags & DE_SOCKET_NODELAY) ? 1 : 0;
		if (setsockopt(fd, IPPROTO_TCP, TCP_NODELAY, (const char*)&mode, sizeof(mode)) != 0)
			return DE_FALSE;
	}

	/* Non-blocking. */
	{
#if defined(DE_USE_WINSOCK)
		u_long mode = (flags & DE_SOCKET_NONBLOCKING) ? 1 : 0;
		if (ioctlsocket(fd, FIONBIO, &mode) != 0)
			return DE_FALSE;
#else
		int oldFlags	= fcntl(fd, F_GETFL, 0);
		int newFlags	= (flags & DE_SOCKET_NONBLOCKING) ? (oldFlags | O_NONBLOCK) : (oldFlags & ~O_NONBLOCK);
		if (fcntl(fd, F_SETFL, newFlags) != 0)
			return DE_FALSE;
#endif
	}

	/* Close on exec. */
	{
#if defined(DE_USE_BERKELEY_SOCKETS)
		int oldFlags = fcntl(fd, F_GETFD, 0);
		int newFlags = (flags & DE_SOCKET_CLOSE_ON_EXEC) ? (oldFlags | FD_CLOEXEC) : (oldFlags & ~FD_CLOEXEC);
		if (fcntl(fd, F_SETFD, newFlags) != 0)
			return DE_FALSE;
#endif
	}

	return DE_TRUE;
}